

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

int MAFSA_automaton_val_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  ulong uVar1;
  undefined3 in_register_00000011;
  int iVar2;
  
  uVar1 = sz_l & 0xffffffff;
  iVar2 = 0;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    iVar2 = iVar2 * CONCAT31(in_register_00000011,delim) + (uint)l[(uint)uVar1 & 0x7fffffff];
  }
  *out = iVar2;
  return 0;
}

Assistant:

extern int MAFSA_automaton_val_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}